

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmMakefileTargetGenerator::CreateResponseFile
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,string *name,
          string *options,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_depends)

{
  cmMakefile *this_00;
  bool bVar1;
  Encoding encoding;
  ostream *poVar2;
  string responseFileNameFull;
  cmAlphaNum local_2f8;
  cmAlphaNum local_2c8;
  cmGeneratedFileStream responseStream;
  
  encoding = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
               _vptr_cmGlobalGenerator[5])();
  if (encoding == UTF8_WITH_BOM) {
    this_00 = (this->super_cmCommonTargetGenerator).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&responseStream,"MSVC",(allocator<char> *)&local_2f8);
    bVar1 = cmMakefile::IsOn(this_00,(string *)&responseStream);
    std::__cxx11::string::~string((string *)&responseStream);
    encoding = bVar1 + UTF8;
  }
  responseStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (this->TargetBuildDirectoryFull)._M_dataplus._M_p;
  responseStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
  _vptr_basic_ostream = (_func_int **)(this->TargetBuildDirectoryFull)._M_string_length;
  local_2f8.View_._M_str = local_2f8.Digits_;
  local_2f8.View_._M_len = 1;
  local_2f8.Digits_[0] = '/';
  cmStrCat<std::__cxx11::string>
            (&responseFileNameFull,(cmAlphaNum *)&responseStream,&local_2f8,name);
  cmGeneratedFileStream::cmGeneratedFileStream(&responseStream,&responseFileNameFull,false,encoding)
  ;
  cmGeneratedFileStream::SetCopyIfDifferent(&responseStream,true);
  poVar2 = std::operator<<((ostream *)&responseStream,(string *)options);
  std::operator<<(poVar2,"\n");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makefile_depends,
             &responseFileNameFull);
  local_2f8.View_._M_str = (this->TargetBuildDirectory)._M_dataplus._M_p;
  local_2f8.View_._M_len = (this->TargetBuildDirectory)._M_string_length;
  local_2c8.View_._M_str = local_2c8.Digits_;
  local_2c8.View_._M_len = 1;
  local_2c8.Digits_[0] = '/';
  cmStrCat<std::__cxx11::string>(__return_storage_ptr__,&local_2f8,&local_2c8,name);
  cmGeneratedFileStream::~cmGeneratedFileStream(&responseStream);
  std::__cxx11::string::~string((string *)&responseFileNameFull);
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::CreateResponseFile(
  const std::string& name, std::string const& options,
  std::vector<std::string>& makefile_depends)
{
  // FIXME: Find a better way to determine the response file encoding,
  // perhaps using tool-specific platform information variables.
  // For now, use the makefile encoding as a heuristic.
  codecvt::Encoding responseEncoding =
    this->GlobalGenerator->GetMakefileEncoding();
  // Non-MSVC tooling may not understand a BOM.
  if (responseEncoding == codecvt::UTF8_WITH_BOM &&
      !this->Makefile->IsOn("MSVC")) {
    responseEncoding = codecvt::UTF8;
  }

  // Create the response file.
  std::string responseFileNameFull =
    cmStrCat(this->TargetBuildDirectoryFull, '/', name);
  cmGeneratedFileStream responseStream(responseFileNameFull, false,
                                       responseEncoding);
  responseStream.SetCopyIfDifferent(true);
  responseStream << options << "\n";

  // Add a dependency so the target will rebuild when the set of
  // objects changes.
  makefile_depends.push_back(std::move(responseFileNameFull));

  // Construct the name to be used on the command line.
  std::string responseFileName =
    cmStrCat(this->TargetBuildDirectory, '/', name);
  return responseFileName;
}